

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_default_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_> local_38;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
            (&local_38,this);
  nonstd::optional_lite::
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_0>
            (__return_storage_ptr__,&local_38);
  nonstd::optional_lite::
  optional<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>::
  ~optional(&local_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }